

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O2

float drmp3_L3_ldexp_q2(float y,int exp_q2)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  do {
    uVar2 = 0x78;
    if (exp_q2 < 0x78) {
      uVar2 = exp_q2;
    }
    y = y * (float)(int)(0x40000000 >> ((byte)(uVar2 >> 2) & 0x1f)) *
            drmp3_L3_ldexp_q2::g_expfrac[uVar2 & 3];
    uVar3 = exp_q2 - uVar2;
    bVar1 = (int)uVar2 <= exp_q2;
    exp_q2 = uVar3;
  } while (uVar3 != 0 && bVar1);
  return y;
}

Assistant:

static float drmp3_L3_ldexp_q2(float y, int exp_q2)
{
    static const float g_expfrac[4] = { 9.31322575e-10f,7.83145814e-10f,6.58544508e-10f,5.53767716e-10f };
    int e;
    do
    {
        e = DRMP3_MIN(30*4, exp_q2);
        y *= g_expfrac[e & 3]*(1 << 30 >> (e >> 2));
    } while ((exp_q2 -= e) > 0);
    return y;
}